

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_movingcamera.cpp
# Opt level: O0

void __thiscall AActorMover::PostBeginPlay(AActorMover *this)

{
  bool bVar1;
  uint uVar2;
  AActor *pAVar3;
  undefined1 local_20 [8];
  TActorIterator<AActor> iterator;
  AActorMover *this_local;
  
  iterator.super_FActorIterator._8_8_ = this;
  APathFollower::PostBeginPlay(&this->super_APathFollower);
  TActorIterator<AActor>::TActorIterator
            ((TActorIterator<AActor> *)local_20,(this->super_APathFollower).super_AActor.args[3]);
  pAVar3 = TActorIterator<AActor>::Next((TActorIterator<AActor> *)local_20);
  TObjPtr<AActor>::operator=(&(this->super_APathFollower).super_AActor.tracer,pAVar3);
  bVar1 = TObjPtr<AActor>::operator==
                    (&(this->super_APathFollower).super_AActor.tracer,(AActor *)0x0);
  if (bVar1) {
    Printf("ActorMover %d: Can\'t find target %d\n",
           (ulong)(uint)(this->super_APathFollower).super_AActor.tid,
           (ulong)(uint)(this->super_APathFollower).super_AActor.args[3]);
  }
  else {
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APathFollower).super_AActor.tracer);
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&pAVar3->flags);
    (this->super_APathFollower).super_AActor.special1 = uVar2;
    pAVar3 = TObjPtr<AActor>::operator->(&(this->super_APathFollower).super_AActor.tracer);
    uVar2 = ::TFlags::operator_cast_to_unsigned_int((TFlags *)&pAVar3->flags2);
    (this->super_APathFollower).super_AActor.special2 = uVar2;
  }
  return;
}

Assistant:

void AActorMover::PostBeginPlay ()
{
	Super::PostBeginPlay ();

	TActorIterator<AActor> iterator (args[3]);
	tracer = iterator.Next ();

	if (tracer == NULL)
	{
		Printf ("ActorMover %d: Can't find target %d\n", tid, args[3]);
	}
	else
	{
		special1 = tracer->flags;
		special2 = tracer->flags2;
	}
}